

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_paused(torrent *this,bool b,pause_flags_t flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  byte local_31;
  bitfield_flag local_1f;
  undefined1 local_1e;
  uchar local_1d;
  uchar local_1c;
  bitfield_flag local_1b;
  uchar local_1a;
  byte local_19;
  bool paused_before;
  torrent *ptStack_18;
  bool b_local;
  torrent *this_local;
  pause_flags_t flags_local;
  
  local_19 = b;
  ptStack_18 = this;
  this_local._7_1_ = flags.m_val;
  iVar3 = num_peers(this);
  if (iVar3 == 0) {
    local_1a = (uchar)libtorrent::flags::
                      bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::operator~
                                (&torrent_handle::graceful_pause);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::operator&=
              ((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
               ((long)&this_local + 7),
               (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)local_1a);
  }
  if (((byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b) & 1) ==
      (local_19 & 1)) {
    local_31 = 0;
    if ((((byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b) & 1) == 1) &&
       (local_31 = 0,
       ((byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f) & 1) == 1)) {
      local_1c = this_local._7_1_;
      local_1d = '\x01';
      local_1b = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)
                            this_local._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)'\x01')
      ;
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1b);
      local_31 = bVar1 ^ 0xff;
    }
    if ((local_31 & 1) != 0) {
      *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
           *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffff7fffffff;
      update_gauge(this);
      do_pause(this,true);
    }
  }
  else {
    bVar1 = is_paused(this);
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffff7ffffff |
         (ulong)(local_19 & 1) << 0x1b;
    local_1e = bVar1;
    bVar2 = is_paused(this);
    if (bVar1 != bVar2) {
      local_1f = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)
                            this_local._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)'\x01')
      ;
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1f);
      *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
           *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffff7fffffff |
           (ulong)bVar1 << 0x1f;
      if ((local_19 & 1) == 0) {
        do_resume(this);
      }
      else {
        do_pause(this,false);
      }
    }
  }
  return;
}

Assistant:

void torrent::set_paused(bool const b, pause_flags_t flags)
	{
		TORRENT_ASSERT(is_single_thread());

		// if there are no peers, there is no point in a graceful pause mode. In
		// fact, the promise to post the torrent_paused_alert exactly once is
		// maintained by the last peer to be disconnected in graceful pause mode,
		// if there are no peers, we must not enter graceful pause mode, and post
		// the torrent_paused_alert immediately instead.
		if (num_peers() == 0)
			flags &= ~torrent_handle::graceful_pause;

		if (m_paused == b)
		{
			// there is one special case here. If we are
			// currently in graceful pause mode, and we just turned into regular
			// paused mode, we need to actually pause the torrent properly
			if (m_paused == true
				&& m_graceful_pause_mode == true
				&& !(flags & torrent_handle::graceful_pause))
			{
				m_graceful_pause_mode = false;
				update_gauge();
				do_pause(true);
			}
			return;
		}

		bool const paused_before = is_paused();

		m_paused = b;

		// the session may still be paused, in which case
		// the effective state of the torrent did not change
		if (paused_before == is_paused()) return;

		m_graceful_pause_mode = bool(flags & torrent_handle::graceful_pause);

		if (b) do_pause();
		else do_resume();
	}